

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * compatibilityAgree_abi_cxx11_
                   (string *__return_storage_ptr__,CompatibleType t,bool dominant)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if (t - NumberMinType < 2) {
    __s = "(Ignored)\n";
    if (dominant) {
      __s = "(Dominant)\n";
    }
    __a = &local_a;
  }
  else {
    if (StringType < t) {
      __assert_fail("false && \"Unreachable!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                    ,0x11ae,"std::string compatibilityAgree(CompatibleType, bool)");
    }
    __s = "(Agree)\n";
    if (dominant) {
      __s = "(Disagree)\n";
    }
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string compatibilityAgree(CompatibleType t, bool dominant)
{
  switch (t) {
    case BoolType:
    case StringType:
      return dominant ? "(Disagree)\n" : "(Agree)\n";
    case NumberMaxType:
    case NumberMinType:
      return dominant ? "(Dominant)\n" : "(Ignored)\n";
  }
  assert(false && "Unreachable!");
  return "";
}